

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O2

void __thiscall embree::Points::Points(Points *this,Device *device,GType gtype)

{
  size_t *psVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  undefined8 *puVar5;
  Device *pDVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined4 extraout_var;
  ulong uVar20;
  ulong uVar21;
  undefined4 extraout_var_00;
  long lVar22;
  size_t i_2;
  size_t i;
  ulong uVar23;
  RawBufferView *this_00;
  ulong uVar24;
  
  Geometry::Geometry(&this->super_Geometry,device,gtype,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Points_021d8fe8;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.num + 4) = 0;
  (this->normals0).super_RawBufferView.modCounter = 1;
  (this->normals0).super_RawBufferView.modified = true;
  (this->normals0).super_RawBufferView.userData = 0;
  (this->normals0).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar6 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar6;
  psVar1 = &(this->vertices).size_active;
  (this->vertices).items = (BufferView<embree::Vec3fx> *)0x0;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->normals).alloc.device = pDVar6;
  psVar2 = &(this->normals).size_active;
  (this->normals).size_active = 0;
  (this->normals).size_alloced = 0;
  (this->normals).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).alloc.device = pDVar6;
  (this->vertexAttribs).items = (BufferView<char> *)0x0;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  this->maxRadiusScale = 1.0;
  uVar24 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar24 == 0) {
    *psVar1 = 0;
  }
  else {
    iVar19 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar24 * 0x38,8,3);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar19);
    this_00 = (RawBufferView *)0x0;
    for (uVar23 = 0; uVar20 = *psVar1, uVar23 < uVar20; uVar23 = uVar23 + 1) {
      pBVar7 = (this->vertices).items;
      pcVar10 = this_00->ptr_ofs;
      pcVar11 = this_00->dptr_ofs;
      sVar12 = this_00->stride;
      sVar13 = this_00->num;
      uVar14 = *(undefined8 *)&this_00->modified;
      puVar3 = (undefined8 *)((long)&(pBVar7->super_RawBufferView).format + (long)this_00);
      *puVar3 = *(undefined8 *)&this_00->format;
      puVar3[1] = uVar14;
      psVar4 = (size_t *)((long)&(pBVar7->super_RawBufferView).stride + (long)this_00);
      *psVar4 = sVar12;
      psVar4[1] = sVar13;
      puVar3 = (undefined8 *)((long)&this_00->ptr_ofs + (long)&pBVar7->super_RawBufferView);
      *puVar3 = pcVar10;
      puVar3[1] = pcVar11;
      *(Buffer **)((long)&this_00->ptr_ofs + (long)&(pBVar7->super_RawBufferView).buffer.ptr) =
           (this_00->buffer).ptr;
      (this_00->buffer).ptr = (Buffer *)0x0;
      RawBufferView::~RawBufferView(this_00);
      this_00 = this_00 + 1;
    }
    lVar22 = uVar20 * 0x38 + 0x30;
    for (; uVar20 < uVar24; uVar20 = uVar20 + 1) {
      pBVar7 = (this->vertices).items;
      puVar3 = (undefined8 *)((long)pBVar7 + lVar22 + -0x20);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)pBVar7 + lVar22 + -0x30);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined8 *)((long)pBVar7 + lVar22 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar7 + lVar22 + -8) = 1;
      *(undefined4 *)((long)pBVar7 + lVar22 + -4) = 0;
      *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar22) = 0;
      lVar22 = lVar22 + 0x38;
    }
    pDVar6 = (this->vertices).alloc.device;
    if (pDVar6 != (Device *)0x0) {
      (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,0);
    }
    (this->vertices).size_active = uVar24;
    (this->vertices).size_alloced = uVar24;
  }
  if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
    uVar20 = (ulong)(this->super_Geometry).numTimeSteps;
    uVar24 = (this->normals).size_alloced;
    uVar23 = uVar24;
    if ((uVar24 < uVar20) && (uVar21 = uVar24, uVar23 = uVar20, uVar24 != 0)) {
      for (; uVar23 = uVar21, uVar21 < uVar20; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
      }
    }
    uVar21 = *psVar2;
    if (uVar20 < uVar21) {
      lVar22 = uVar20 * 0x38;
      for (uVar24 = uVar20; uVar24 < uVar21; uVar24 = uVar24 + 1) {
        RawBufferView::~RawBufferView
                  ((RawBufferView *)
                   ((long)&(((this->normals).items)->super_RawBufferView).ptr_ofs + lVar22));
        uVar21 = (this->normals).size_active;
        lVar22 = lVar22 + 0x38;
      }
      (this->normals).size_active = uVar20;
      uVar24 = (this->normals).size_alloced;
      uVar21 = uVar20;
    }
    if (uVar24 == uVar23) {
      lVar22 = uVar21 * 0x38 + 0x30;
      for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
        pBVar8 = (this->normals).items;
        puVar3 = (undefined8 *)((long)pBVar8 + lVar22 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar8 + lVar22 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar8 + lVar22 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar8 + lVar22 + -8) = 1;
        *(undefined4 *)((long)pBVar8 + lVar22 + -4) = 0;
        *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22) = 0;
        lVar22 = lVar22 + 0x38;
      }
      *psVar2 = uVar20;
    }
    else {
      pDVar6 = (this->normals).alloc.device;
      pBVar8 = (this->normals).items;
      iVar19 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar23 * 0x38,8,3);
      (this->normals).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var_00,iVar19);
      lVar22 = 0;
      for (uVar24 = 0; uVar21 = *psVar2, uVar24 < uVar21; uVar24 = uVar24 + 1) {
        pBVar9 = (this->normals).items;
        puVar3 = (undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22);
        uVar14 = *puVar3;
        uVar15 = puVar3[1];
        puVar3 = (undefined8 *)((long)&(pBVar8->super_RawBufferView).stride + lVar22);
        uVar16 = *puVar3;
        uVar17 = puVar3[1];
        puVar3 = (undefined8 *)((long)&(pBVar8->super_RawBufferView).format + lVar22);
        uVar18 = puVar3[1];
        puVar5 = (undefined8 *)((long)&(pBVar9->super_RawBufferView).format + lVar22);
        *puVar5 = *puVar3;
        puVar5[1] = uVar18;
        puVar3 = (undefined8 *)((long)&(pBVar9->super_RawBufferView).stride + lVar22);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar22);
        *puVar3 = uVar14;
        puVar3[1] = uVar15;
        *(undefined8 *)((long)&(pBVar9->super_RawBufferView).buffer.ptr + lVar22) =
             *(undefined8 *)((long)&(pBVar8->super_RawBufferView).buffer.ptr + lVar22);
        *(undefined8 *)((long)&(pBVar8->super_RawBufferView).buffer.ptr + lVar22) = 0;
        RawBufferView::~RawBufferView
                  ((RawBufferView *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22));
        lVar22 = lVar22 + 0x38;
      }
      lVar22 = uVar21 * 0x38 + 0x30;
      for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
        pBVar9 = (this->normals).items;
        puVar3 = (undefined8 *)((long)pBVar9 + lVar22 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar9 + lVar22 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar9 + lVar22 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar9 + lVar22 + -8) = 1;
        *(undefined4 *)((long)pBVar9 + lVar22 + -4) = 0;
        *(undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar22) = 0;
        lVar22 = lVar22 + 0x38;
      }
      pDVar6 = (this->normals).alloc.device;
      if (pDVar6 != (Device *)0x0) {
        (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,pBVar8);
      }
      (this->normals).size_active = uVar20;
      (this->normals).size_alloced = uVar23;
    }
  }
  return;
}

Assistant:

Points::Points(Device* device, Geometry::GType gtype) : Geometry(device, gtype, 0, 1)
  {
    vertices.resize(numTimeSteps);
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals.resize(numTimeSteps);
  }